

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Scroll.cxx
# Opt level: O0

void __thiscall Fl_Scroll::scroll_to(Fl_Scroll *this,int X,int Y)

{
  Fl_Widget *this_00;
  int iVar1;
  int iVar2;
  Fl_Window *pFVar3;
  Fl_Window *pFVar4;
  int iVar5;
  int iVar6;
  Fl_Widget **ppFVar7;
  Fl_Widget *o;
  Fl_Widget **ppFStack_28;
  int i;
  Fl_Widget **a;
  int dy;
  int dx;
  int Y_local;
  int X_local;
  Fl_Scroll *this_local;
  
  iVar5 = this->xposition_ - X;
  iVar1 = this->yposition_ - Y;
  if ((iVar5 != 0) || (iVar1 != 0)) {
    this->xposition_ = X;
    this->yposition_ = Y;
    ppFStack_28 = Fl_Group::array(&this->super_Fl_Group);
    o._4_4_ = Fl_Group::children(&this->super_Fl_Group);
    while (iVar6 = o._4_4_ + -1, o._4_4_ != 0) {
      ppFVar7 = ppFStack_28 + 1;
      this_00 = *ppFStack_28;
      o._4_4_ = iVar6;
      ppFStack_28 = ppFVar7;
      if (((Fl_Scrollbar *)this_00 != &this->hscrollbar) &&
         ((Fl_Scrollbar *)this_00 != &this->scrollbar)) {
        iVar6 = Fl_Widget::x(this_00);
        iVar2 = Fl_Widget::y(this_00);
        Fl_Widget::position(this_00,iVar6 + iVar5,iVar2 + iVar1);
      }
    }
    pFVar3 = (Fl_Window *)Fl_Widget::parent((Fl_Widget *)this);
    pFVar4 = Fl_Widget::window((Fl_Widget *)this);
    if ((pFVar3 == pFVar4) && (Fl::scheme_bg_ != (Fl_Image *)0x0)) {
      Fl_Widget::damage((Fl_Widget *)this,0x80);
    }
    else {
      Fl_Widget::damage((Fl_Widget *)this,'\x04');
    }
  }
  return;
}

Assistant:

void Fl_Scroll::scroll_to(int X, int Y) {
  int dx = xposition_-X;
  int dy = yposition_-Y;
  if (!dx && !dy) return;
  xposition_ = X;
  yposition_ = Y;
  Fl_Widget*const* a = array();
  for (int i=children(); i--;) {
    Fl_Widget* o = *a++;
    if (o == &hscrollbar || o == &scrollbar) continue;
    o->position(o->x()+dx, o->y()+dy);
  }
  if (parent() == (Fl_Group *)window() && Fl::scheme_bg_) damage(FL_DAMAGE_ALL);
  else damage(FL_DAMAGE_SCROLL);
}